

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,char *filename)

{
  _Alloc_hider filename_00;
  bool bVar1;
  bool bVar2;
  char *in_base;
  cmMessenger *messenger;
  ListFileScope scope;
  string filenametoread;
  cmListFile listFile;
  allocator local_89;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  cmStateDirectory local_48;
  
  std::__cxx11::string::string((string *)local_88,filename,&local_89);
  cmStateSnapshot::GetDirectory(&local_48,&this->StateSnapshot);
  in_base = cmStateDirectory::GetCurrentSource(&local_48);
  cmsys::SystemTools::CollapseFullPath(&local_68,(string *)local_88,in_base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._0_8_ != &local_78) {
    operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
  }
  ListFileScope::ListFileScope((ListFileScope *)local_88,this,&local_68);
  filename_00._M_p = local_68._M_dataplus._M_p;
  local_48.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  local_48.DirectoryState.Position = 0;
  local_48.Snapshot_.State = (cmState *)0x0;
  messenger = cmake::GetMessenger(this->GlobalGenerator->CMakeInstance);
  bVar1 = cmListFile::ParseFile((cmListFile *)&local_48,filename_00._M_p,messenger,&this->Backtrace)
  ;
  if (bVar1) {
    ReadListFile(this,(cmListFile *)&local_48,&local_68);
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar2 = cmSystemTools::GetInterruptFlag();
      if (!bVar2) goto LAB_002b8e54;
    }
    local_88[8] = false;
  }
LAB_002b8e54:
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector
            ((vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *)&local_48);
  ListFileScope::~ListFileScope((ListFileScope *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmMakefile::ReadListFile(const char* filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->ReadListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }
  return true;
}